

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O2

void ylt::metric::detail::stat_cpu(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int64_t iVar5;
  string *psVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  rusage usage;
  allocator<char> local_b9;
  double local_b8;
  double local_b0;
  rusage local_a8;
  
  if ((stat_cpu()::process_cpu_usage == '\0') &&
     (iVar4 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage), iVar4 != 0)) {
    psVar6 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"ylt_process_cpu_usage",&local_b9);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)&stat_cpu::process_cpu_usage,
               psVar6);
    std::__cxx11::string::~string((string *)&local_a8);
    __cxa_atexit(std::
                 __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&stat_cpu::process_cpu_usage,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage);
  }
  if ((stat_cpu()::process_cpu_usage_system == '\0') &&
     (iVar4 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage_system), iVar4 != 0)) {
    psVar6 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"ylt_process_cpu_usage_system",&local_b9);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
               &stat_cpu::process_cpu_usage_system,psVar6);
    std::__cxx11::string::~string((string *)&local_a8);
    __cxa_atexit(std::
                 __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&stat_cpu::process_cpu_usage_system,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage_system);
  }
  if ((stat_cpu()::process_cpu_usage_user == '\0') &&
     (iVar4 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage_user), iVar4 != 0)) {
    psVar6 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"ylt_process_cpu_usage_user",&local_b9);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
               &stat_cpu::process_cpu_usage_user,psVar6);
    std::__cxx11::string::~string((string *)&local_a8);
    __cxa_atexit(std::
                 __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&stat_cpu::process_cpu_usage_user,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage_user);
  }
  memset(&local_a8,0,0x90);
  getrusage(RUSAGE_SELF,&local_a8);
  lVar7 = local_a8.ru_utime.tv_sec * 1000000 + local_a8.ru_utime.tv_usec;
  lVar8 = local_a8.ru_stime.tv_sec * 1000000 + local_a8.ru_stime.tv_usec;
  iVar5 = gettimeofday_us();
  lVar1 = iVar5;
  lVar2 = lVar8;
  lVar3 = lVar7;
  if ((last_time_us != 0) &&
     (lVar1 = last_time_us, lVar2 = last_sys_time_us, lVar3 = last_user_time_us,
     iVar5 - last_time_us != 0)) {
    dVar9 = (double)(iVar5 - last_time_us);
    local_b8 = (double)(lVar8 - last_sys_time_us) / dVar9;
    local_b0 = (double)(lVar7 - last_user_time_us) / dVar9;
    basic_static_counter<long>::update
              (&(stat_cpu::process_cpu_usage.
                 super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_basic_static_counter<long>,
               (long)((double)(((lVar8 + lVar7) - last_sys_time_us) - last_user_time_us) / dVar9));
    basic_static_counter<long>::update
              (&(stat_cpu::process_cpu_usage_system.
                 super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_basic_static_counter<long>,(long)local_b8);
    basic_static_counter<long>::update
              (&(stat_cpu::process_cpu_usage_user.
                 super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_basic_static_counter<long>,(long)local_b0);
    lVar1 = iVar5;
    lVar2 = lVar8;
    lVar3 = lVar7;
  }
  last_user_time_us = lVar3;
  last_sys_time_us = lVar2;
  last_time_us = lVar1;
  return;
}

Assistant:

inline void stat_cpu() {
  static auto process_cpu_usage =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage");
  static auto process_cpu_usage_system =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage_system");
  static auto process_cpu_usage_user =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage_user");

  rusage usage{};
  getrusage(RUSAGE_SELF, &usage);
  int64_t utime = timeval_to_microseconds(usage.ru_utime);
  int64_t stime = timeval_to_microseconds(usage.ru_stime);
  int64_t time_total = utime + stime;
  int64_t now = gettimeofday_us();
  if (last_time_us == 0) {
    last_time_us = now;
    last_sys_time_us = stime;
    last_user_time_us = utime;
    return;
  }

  int64_t elapsed = now - last_time_us;
  if (elapsed == 0) {
    return;
  }

  double cpu_usage =
      double(time_total - (last_sys_time_us + last_user_time_us)) /
      (now - last_time_us);
  double sys_cpu_usage =
      double(stime - last_sys_time_us) / (now - last_time_us);
  double usr_cpu_usage =
      double(utime - last_user_time_us) / (now - last_time_us);
  process_cpu_usage->update(cpu_usage);
  process_cpu_usage_system->update(sys_cpu_usage);
  process_cpu_usage_user->update(usr_cpu_usage);

  last_time_us = now;
  last_sys_time_us = stime;
  last_user_time_us = utime;
}